

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulator.cpp
# Opt level: O1

void anon_unknown.dwarf_1809b4::Modulator_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *this;
  
  if (param == 2) {
    if ((0.0 <= val) && (val <= 24000.0)) {
      props = (EffectProps *)&(props->Reverb).Diffusion;
LAB_0014913c:
      (props->Reverb).Density = val;
      return;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Modulator high-pass cutoff out of range");
  }
  else if (param == 1) {
    if ((0.0 <= val) && (val <= 8000.0)) goto LAB_0014913c;
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Modulator frequency out of range");
  }
  else {
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid modulator float property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Modulator_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_RING_MODULATOR_FREQUENCY:
        if(!(val >= AL_RING_MODULATOR_MIN_FREQUENCY && val <= AL_RING_MODULATOR_MAX_FREQUENCY))
            throw effect_exception{AL_INVALID_VALUE, "Modulator frequency out of range"};
        props->Modulator.Frequency = val;
        break;

    case AL_RING_MODULATOR_HIGHPASS_CUTOFF:
        if(!(val >= AL_RING_MODULATOR_MIN_HIGHPASS_CUTOFF && val <= AL_RING_MODULATOR_MAX_HIGHPASS_CUTOFF))
            throw effect_exception{AL_INVALID_VALUE, "Modulator high-pass cutoff out of range"};
        props->Modulator.HighPassCutoff = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid modulator float property 0x%04x", param};
    }
}